

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_coroutine_running(lua_State *L)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  int ismain;
  lua_State *in_stack_ffffffffffffffe8;
  
  iVar2 = lua_pushthread(in_stack_ffffffffffffffe8);
  lVar1 = *(long *)(in_RDI + 0x18);
  *(long *)(in_RDI + 0x18) = lVar1 + 8;
  *(int *)(lVar1 + 4) = -2 - iVar2;
  return 2;
}

Assistant:

LJLIB_CF(coroutine_running)
{
#if LJ_52
  int ismain = lua_pushthread(L);
  setboolV(L->top++, ismain);
  return 2;
#else
  if (lua_pushthread(L))
    setnilV(L->top++);
  return 1;
#endif
}